

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlHandle __thiscall
despot::util::tinyxml::TiXmlHandle::ChildElement(TiXmlHandle *this,char *value,int count)

{
  int in_ECX;
  undefined4 in_register_00000014;
  TiXmlElement *local_30;
  TiXmlElement *child;
  int i;
  int count_local;
  char *value_local;
  TiXmlHandle *this_local;
  
  if (*(long *)value != 0) {
    local_30 = TiXmlNode::FirstChildElement
                         (*(TiXmlNode **)value,(char *)CONCAT44(in_register_00000014,count));
    for (child._0_4_ = 0; local_30 != (TiXmlElement *)0x0 && (int)child < in_ECX;
        child._0_4_ = (int)child + 1) {
      local_30 = TiXmlNode::NextSiblingElement
                           (&local_30->super_TiXmlNode,(char *)CONCAT44(in_register_00000014,count))
      ;
    }
    if (local_30 != (TiXmlElement *)0x0) {
      TiXmlHandle(this,&local_30->super_TiXmlNode);
      return (TiXmlHandle)(TiXmlNode *)this;
    }
  }
  TiXmlHandle(this,(TiXmlNode *)0x0);
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::ChildElement(const char* value, int count) const {
	if (node) {
		int i;
		TiXmlElement* child = node->FirstChildElement(value);
		for (i = 0; child && i < count;
			child = child->NextSiblingElement(value), ++i) {
			// nothing
		}
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}